

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_utils.c
# Opt level: O2

void End(WebPWorker *worker)

{
  pthread_mutex_t *__mutex;
  WebPWorkerImpl *impl;
  
  __mutex = (pthread_mutex_t *)worker->impl_;
  if (__mutex != (pthread_mutex_t *)0x0) {
    ChangeState(worker,NOT_OK);
    pthread_join(*(pthread_t *)((long)__mutex + 0x58),(void **)0x0);
    pthread_mutex_destroy(__mutex);
    pthread_cond_destroy((pthread_cond_t *)(__mutex + 1));
    WebPSafeFree(__mutex);
    worker->impl_ = (void *)0x0;
  }
  return;
}

Assistant:

static void End(WebPWorker* const worker) {
#ifdef WEBP_USE_THREAD
  if (worker->impl_ != NULL) {
    WebPWorkerImpl* const impl = (WebPWorkerImpl*)worker->impl_;
    ChangeState(worker, NOT_OK);
    pthread_join(impl->thread_, NULL);
    pthread_mutex_destroy(&impl->mutex_);
    pthread_cond_destroy(&impl->condition_);
    WebPSafeFree(impl);
    worker->impl_ = NULL;
  }
#else
  worker->status_ = NOT_OK;
  assert(worker->impl_ == NULL);
#endif
  assert(worker->status_ == NOT_OK);
}